

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.hpp
# Opt level: O0

bool __thiscall
ProtocolWrite<unsigned_short,_6UL,_(unsigned_short)1486>::parseReturnBuffer
          (ProtocolWrite<unsigned_short,_6UL,_(unsigned_short)1486> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer)

{
  bool bVar1;
  reference pvVar2;
  size_type n;
  ostream *poVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer_local;
  ProtocolWrite<unsigned_short,_6UL,_(unsigned_short)1486> *this_local;
  
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](buffer,0);
  n = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(buffer);
  bVar1 = ProtocolBase::isValid(&this->super_ProtocolBase,pvVar2,n);
  if (bVar1) {
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](buffer,7);
    if (*pvVar2 == '\x01') {
      poVar3 = std::operator<<((ostream *)&std::cout,"OK::ProtocolWrite::Write succeeded");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "ERROR::ProtocolWrite::Received Frame is not valid");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool parseReturnBuffer(std::vector<uint8_t> &buffer) {
        if (!isValid(&buffer[0], buffer.size())) {
            std::cout << "ERROR::ProtocolWrite::Received Frame is not valid" << std::endl;
            return false;
        }

        if(buffer[7] == 0x01) {
            std::cout << "OK::ProtocolWrite::Write succeeded" << std::endl;
            return true;
        }
        else
            return false;

    }